

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O3

exr_attr_box2i_t __thiscall Imf_3_4::Context::dataWindow(Context *this,int partidx)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *this_00;
  undefined4 in_register_00000034;
  exr_attr_box2i_t dw;
  stringstream _iex_throw_s;
  exr_attr_box2i_t local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar1 = exr_get_data_window(*(this->_ctxt).
                               super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,CONCAT44(in_register_00000034,partidx),&local_1b0);
  if (iVar1 == 0) {
    return local_1b0;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Unable to get the data window for part ",0x27);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,partidx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," in file \'",10);
  pcVar3 = fileName(this);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

exr_attr_box2i_t
Context::dataWindow (int partidx) const
{
    exr_attr_box2i_t dw;

    if (EXR_ERR_SUCCESS != exr_get_data_window (*_ctxt, partidx, &dw))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get the data window for part " << partidx << " in file '"
                                                      << fileName () << "'");
    }

    return dw;
}